

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O2

void __thiscall
duckdb::TableCatalogEntry::BindUpdateConstraints
          (TableCatalogEntry *this,Binder *binder,LogicalGet *get,LogicalProjection *proj,
          LogicalUpdate *update,ClientContext *context)

{
  ColumnList *columns;
  pointer pPVar1;
  pointer pIVar2;
  bool bVar3;
  pointer pBVar4;
  BoundCheckConstraint *pBVar5;
  ColumnDefinition *pCVar6;
  iterator iVar7;
  LogicalType *this_00;
  unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
  *constraint;
  pointer this_01;
  pointer pPVar8;
  pointer pIVar9;
  ColumnListIterator CVar10;
  physical_index_set_t all_columns;
  ColumnLogicalIteratorInternal __end2;
  TableStorageInfo table_storage_info;
  ColumnLogicalIteratorInternal __end2_1;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  undefined1 local_100 [40];
  size_t local_d8;
  __node_base_ptr ap_Stack_d0 [2];
  ColumnLogicalIteratorInternal local_c0;
  undefined1 local_a0 [8];
  vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_> local_98;
  value_type local_80;
  ColumnListIterator local_78;
  ColumnLogicalIteratorInternal local_68;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_48;
  
  columns = &this->columns;
  Binder::BindConstraints
            ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&local_48,binder,&this->constraints,
             &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name,columns);
  for (this_01 = local_48.
                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      local_48.
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    pBVar4 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->(this_01);
    if (pBVar4->type == CHECK) {
      pBVar4 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_01);
      pBVar5 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(pBVar4);
      LogicalUpdate::BindExtraColumns(this,get,proj,update,&pBVar5->bound_columns);
    }
  }
  if (update->return_chunk != false) {
    local_100._0_8_ = ap_Stack_d0;
    local_100._8_8_ = (__buckets_ptr)0x1;
    local_100._16_8_ = (_Hash_node_base *)0x0;
    local_100._24_8_ = (_Hash_node_base *)0x0;
    local_100._32_4_ = 1.0;
    local_d8 = 0;
    ap_Stack_d0[0] = (__node_base_ptr)0x0;
    CVar10 = ColumnList::Physical(columns);
    local_68.list = CVar10.list;
    local_68.physical = CVar10.physical;
    ColumnList::ColumnListIterator::begin
              ((ColumnLogicalIteratorInternal *)local_a0,(ColumnListIterator *)&local_68);
    ColumnList::ColumnListIterator::end(&local_c0,(ColumnListIterator *)&local_68);
    while (((local_98.super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish != (pointer)local_c0.pos ||
            (local_98.super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_c0.end)) ||
           (local_a0 != (undefined1  [8])local_c0.list))) {
      pCVar6 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                         ((ColumnLogicalIteratorInternal *)local_a0);
      local_78.list = (ColumnList *)ColumnDefinition::Physical(pCVar6);
      ::std::__detail::
      _Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)local_100,(value_type *)&local_78);
      local_98.super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&(local_98.
                      super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->is_primary;
    }
    LogicalUpdate::BindExtraColumns(this,get,proj,update,(physical_index_set_t *)local_100);
    ::std::
    _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_100);
  }
  update->update_is_del_and_insert = false;
  (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x17])
            (local_a0,this,context);
  pIVar2 = local_98.super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pIVar9 = local_98.super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar2; pIVar9 = pIVar9 + 1) {
    IndexInfo::IndexInfo((IndexInfo *)local_100,pIVar9);
    pPVar8 = (update->columns).
             super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (update->columns).
             super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pPVar8 == pPVar1) goto LAB_015fb28f;
      iVar7 = ::std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(local_100 + 8),&pPVar8->index);
      pPVar8 = pPVar8 + 1;
    } while (iVar7.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0);
    update->update_is_del_and_insert = true;
LAB_015fb28f:
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)(local_100 + 8));
  }
  pPVar8 = (update->columns).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar1 = (update->columns).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pPVar8 == pPVar1) {
      if ((update->update_is_del_and_insert & 1U) != 0) goto LAB_015fb2eb;
      goto LAB_015fb3e3;
    }
    pCVar6 = ColumnList::GetColumn(columns,(PhysicalIndex)pPVar8->index);
    this_00 = ColumnDefinition::Type(pCVar6);
    bVar3 = LogicalType::SupportsRegularUpdate(this_00);
    pPVar8 = pPVar8 + 1;
  } while (bVar3);
  update->update_is_del_and_insert = true;
LAB_015fb2eb:
  local_100._0_8_ = ap_Stack_d0;
  local_100._8_8_ = (__buckets_ptr)0x1;
  local_100._16_8_ = (_Hash_node_base *)0x0;
  local_100._24_8_ = (_Hash_node_base *)0x0;
  local_100._32_4_ = 1.0;
  local_d8 = 0;
  ap_Stack_d0[0] = (__node_base_ptr)0x0;
  CVar10 = ColumnList::Physical(columns);
  local_78.list = CVar10.list;
  local_78.physical = CVar10.physical;
  ColumnList::ColumnListIterator::begin(&local_c0,&local_78);
  ColumnList::ColumnListIterator::end(&local_68,&local_78);
  while (((local_c0.pos != local_68.pos || (local_c0.end != local_68.end)) ||
         (local_c0.list != local_68.list))) {
    pCVar6 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_c0);
    local_80.index = (idx_t)ColumnDefinition::Physical(pCVar6);
    ::std::__detail::
    _Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)local_100,&local_80);
    local_c0.pos = local_c0.pos + 1;
  }
  LogicalUpdate::BindExtraColumns(this,get,proj,update,(physical_index_set_t *)local_100);
  ::std::
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_100);
LAB_015fb3e3:
  ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::~vector(&local_98);
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void TableCatalogEntry::BindUpdateConstraints(Binder &binder, LogicalGet &get, LogicalProjection &proj,
                                              LogicalUpdate &update, ClientContext &context) {
	// check the constraints and indexes of the table to see if we need to project any additional columns
	// we do this for indexes with multiple columns and CHECK constraints in the UPDATE clause
	// suppose we have a constraint CHECK(i + j < 10); now we need both i and j to check the constraint
	// if we are only updating one of the two columns we add the other one to the UPDATE set
	// with a "useless" update (i.e. i=i) so we can verify that the CHECK constraint is not violated
	auto bound_constraints = binder.BindConstraints(constraints, name, columns);
	for (auto &constraint : bound_constraints) {
		if (constraint->type == ConstraintType::CHECK) {
			auto &check = constraint->Cast<BoundCheckConstraint>();
			// check constraint! check if we need to add any extra columns to the UPDATE clause
			LogicalUpdate::BindExtraColumns(*this, get, proj, update, check.bound_columns);
		}
	}
	if (update.return_chunk) {
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
	// for index updates we always turn any update into an insert and a delete
	// we thus need all the columns to be available, hence we check if the update touches any index columns
	// If the returning keyword is used, we need access to the whole row in case the user requests it.
	// Therefore switch the update to a delete and insert.
	update.update_is_del_and_insert = false;
	TableStorageInfo table_storage_info = GetStorageInfo(context);
	for (auto index : table_storage_info.index_info) {
		for (auto &column : update.columns) {
			if (index.column_set.find(column.index) != index.column_set.end()) {
				update.update_is_del_and_insert = true;
				break;
			}
		}
	};

	// we also convert any updates on LIST columns into delete + insert
	for (auto &col_index : update.columns) {
		auto &column = GetColumns().GetColumn(col_index);
		if (!column.Type().SupportsRegularUpdate()) {
			update.update_is_del_and_insert = true;
			break;
		}
	}

	if (update.update_is_del_and_insert) {
		// the update updates a column required by an index or requires returning the updated rows,
		// push projections for all columns
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
}